

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestIterationEnd
          (StreamingListener *this,UnitTest *unit_test,int param_2)

{
  bool value;
  TimeInMillis local_f8;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  value = UnitTest::Passed(unit_test);
  FormatBool_abi_cxx11_(&local_f0,this,value);
  std::operator+(&local_b0,"event=TestIterationEnd&passed=",&local_f0);
  std::operator+(&local_90,&local_b0,"&elapsed_time=");
  local_f8 = unit_test->impl_->elapsed_time_;
  StreamableToString<long_long>(&local_d0,&local_f8);
  std::operator+(&local_70,&local_90,&local_d0);
  std::operator+(&local_50,&local_70,"ms");
  SendLn(this,&local_50);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void OnTestIterationEnd(const UnitTest& unit_test, int /* iteration */) {
    SendLn("event=TestIterationEnd&passed=" +
           FormatBool(unit_test.Passed()) + "&elapsed_time=" +
           StreamableToString(unit_test.elapsed_time()) + "ms");
  }